

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

box3f * __thiscall pbrt::TriangleMesh::getBounds(TriangleMesh *this)

{
  undefined8 uVar1;
  bool bVar2;
  vec3f *p;
  long in_RSI;
  box3f *in_RDI;
  vec3f v;
  iterator __end2;
  iterator __begin2;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *__range2;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff78;
  box3f *__lhs;
  __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
  local_50;
  box3f *in_stack_ffffffffffffffc0;
  undefined8 local_2c;
  undefined8 local_24;
  undefined8 local_1c;
  
  if ((*(byte *)(in_RSI + 0xf8) & 1) == 0) {
    __lhs = in_RDI;
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffff78);
    if ((*(byte *)(in_RSI + 0xf8) & 1) == 0) {
      math::box3f::empty_box();
      *(undefined8 *)(in_RSI + 0xfc) = local_2c;
      *(undefined8 *)(in_RSI + 0x104) = local_24;
      *(undefined8 *)(in_RSI + 0x10c) = local_1c;
      p = (vec3f *)(in_RSI + 0x70);
      local_50._M_current =
           (vec3f *)std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::begin
                              ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
                               in_stack_ffffffffffffff78);
      std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::end
                ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
                 in_stack_ffffffffffffff78);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
                            *)__lhs,(__normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
                                     *)in_stack_ffffffffffffff78);
        if (!bVar2) break;
        __gnu_cxx::
        __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
        ::operator*(&local_50);
        math::box3f::extend(in_stack_ffffffffffffffc0,p);
        __gnu_cxx::
        __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
        ::operator++(&local_50);
      }
      *(undefined1 *)(in_RSI + 0xf8) = 1;
      uVar1 = *(undefined8 *)(in_RSI + 0xfc);
      (__lhs->lower).x = (float)(int)uVar1;
      (__lhs->lower).y = (float)(int)((ulong)uVar1 >> 0x20);
      *(undefined8 *)&(__lhs->lower).z = *(undefined8 *)(in_RSI + 0x104);
      uVar1 = *(undefined8 *)(in_RSI + 0x10c);
      (__lhs->upper).y = (float)(int)uVar1;
      (__lhs->upper).z = (float)(int)((ulong)uVar1 >> 0x20);
    }
    else {
      uVar1 = *(undefined8 *)(in_RSI + 0xfc);
      (__lhs->lower).x = (float)(int)uVar1;
      (__lhs->lower).y = (float)(int)((ulong)uVar1 >> 0x20);
      *(undefined8 *)&(__lhs->lower).z = *(undefined8 *)(in_RSI + 0x104);
      uVar1 = *(undefined8 *)(in_RSI + 0x10c);
      (__lhs->upper).y = (float)(int)uVar1;
      (__lhs->upper).z = (float)(int)((ulong)uVar1 >> 0x20);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1b3dab);
  }
  else {
    uVar1 = *(undefined8 *)(in_RSI + 0xfc);
    (in_RDI->lower).x = (float)(int)uVar1;
    (in_RDI->lower).y = (float)(int)((ulong)uVar1 >> 0x20);
    *(undefined8 *)&(in_RDI->lower).z = *(undefined8 *)(in_RSI + 0x104);
    uVar1 = *(undefined8 *)(in_RSI + 0x10c);
    (in_RDI->upper).y = (float)(int)uVar1;
    (in_RDI->upper).z = (float)(int)((ulong)uVar1 >> 0x20);
  }
  return in_RDI;
}

Assistant:

box3f TriangleMesh::getBounds() 
  {
    if (!haveComputedBounds) {
      std::lock_guard<std::mutex> lock(mutex);
      if (haveComputedBounds) return bounds;
      bounds = box3f::empty_box();
      for (auto v : vertex) {
        bounds.extend(v);
      }
      
      haveComputedBounds = true;
      return bounds;
    }
    return bounds;
  }